

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh.cxx
# Opt level: O0

void __thiscall write_face::operator()(write_face *this,lw_face *face,xr_writer *w)

{
  xr_writer *w_local;
  lw_face *face_local;
  write_face *this_local;
  
  xray_re::xr_writer::w_u32(w,(face->field_0).field_0.v[0]);
  xray_re::xr_writer::w_u32(w,(face->field_0).field_0.ref[0]);
  xray_re::xr_writer::w_u32(w,(face->field_0).field_0.v[1]);
  xray_re::xr_writer::w_u32(w,(face->field_0).field_0.ref[1]);
  xray_re::xr_writer::w_u32(w,(face->field_0).field_0.v[2]);
  xray_re::xr_writer::w_u32(w,(face->field_0).field_0.ref[2]);
  return;
}

Assistant:

void operator()(const lw_face& face, xr_writer& w) const {
	w.w_u32(face.v0);
	w.w_u32(face.ref0);
	w.w_u32(face.v1);
	w.w_u32(face.ref1);
	w.w_u32(face.v2);
	w.w_u32(face.ref2);
}